

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseCacheCoverage.cxx
# Opt level: O0

bool __thiscall cmParseCacheCoverage::ReadCMCovFile(cmParseCacheCoverage *this,char *file)

{
  cmCTest *pcVar1;
  string_view str;
  byte bVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  char *pcVar6;
  size_type sVar7;
  reference pvVar8;
  ulong uVar9;
  mapped_type *this_00;
  reference pvVar10;
  value_type_conflict2 local_fc4;
  string local_fc0 [32];
  undefined1 local_fa0 [8];
  ostringstream cmCTestLog_msg_7;
  int count;
  size_type linenumber;
  SingleFileCoverageVector *coverageVector;
  string local_e00 [32];
  undefined1 local_de0 [8];
  ostringstream cmCTestLog_msg_6;
  string local_c68 [32];
  undefined1 local_c48 [8];
  ostringstream cmCTestLog_msg_5;
  string local_ad0 [32];
  undefined1 local_ab0 [8];
  ostringstream cmCTestLog_msg_4;
  ulong local_938;
  size_type i;
  undefined1 local_910 [8];
  ostringstream cmCTestLog_msg_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_798;
  undefined1 local_780 [8];
  string filepath;
  string routine;
  undefined1 local_720 [8];
  ostringstream cmCTestLog_msg_2;
  undefined1 local_5a8 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  separateLine;
  undefined1 local_570 [8];
  ostringstream cmCTestLog_msg_1;
  undefined1 local_3f8 [8];
  string line;
  string local_3d0 [32];
  undefined1 local_3b0 [8];
  ostringstream cmCTestLog_msg;
  long local_228;
  ifstream in;
  char *file_local;
  cmParseCacheCoverage *this_local;
  
  std::ifstream::ifstream(&local_228,file,_S_in);
  bVar2 = std::ios::operator!((ios *)((long)&local_228 + *(long *)(local_228 + -0x18)));
  if ((bVar2 & 1) != 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3b0);
    poVar5 = std::operator<<((ostream *)local_3b0,"Can not open : ");
    poVar5 = std::operator<<(poVar5,file);
    std::operator<<(poVar5,"\n");
    pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x4d,pcVar6,false);
    std::__cxx11::string::~string(local_3d0);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3b0);
    this_local._7_1_ = false;
    line.field_2._12_4_ = 1;
    goto LAB_0021dbce;
  }
  std::__cxx11::string::string((string *)local_3f8);
  bVar3 = cmsys::SystemTools::GetLineFromStream
                    ((istream *)&local_228,(string *)local_3f8,(bool *)0x0,0xffffffffffffffff);
  if (bVar3) {
    cmsys::SystemTools::SplitString
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_5a8,(string *)local_3f8,',',false);
    sVar7 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_5a8);
    if (sVar7 == 4) {
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5a8,0);
      bVar3 = std::operator!=(pvVar8,"Routine");
      if (bVar3) goto LAB_0021d07d;
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5a8,1);
      bVar3 = std::operator!=(pvVar8,"Line");
      if (bVar3) goto LAB_0021d07d;
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5a8,2);
      bVar3 = std::operator!=(pvVar8,"RtnLine");
      if (bVar3) goto LAB_0021d07d;
      pvVar8 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)local_5a8,3);
      bVar3 = std::operator!=(pvVar8,"Code");
      if (bVar3) goto LAB_0021d07d;
    }
    else {
LAB_0021d07d:
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_720);
      poVar5 = std::operator<<((ostream *)local_720,"Bad first line of cmcov file : ");
      poVar5 = std::operator<<(poVar5,file);
      poVar5 = std::operator<<(poVar5,"  line:\n[");
      poVar5 = std::operator<<(poVar5,(string *)local_3f8);
      std::operator<<(poVar5,"]\n");
      pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
      std::__cxx11::ostringstream::str();
      pcVar6 = (char *)std::__cxx11::string::c_str();
      cmCTest::Log(pcVar1,7,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                   ,0x62,pcVar6,false);
      std::__cxx11::string::~string((string *)(routine.field_2._M_local_buf + 8));
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_720);
    }
    std::__cxx11::string::string((string *)(filepath.field_2._M_local_buf + 8));
    std::__cxx11::string::string((string *)local_780);
    while (bVar3 = cmsys::SystemTools::GetLineFromStream
                             ((istream *)&local_228,(string *)local_3f8,(bool *)0x0,
                              0xffffffffffffffff), bVar3) {
      cmsys::SystemTools::SplitString(&local_798,(string *)local_3f8,',',false);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_5a8,&local_798);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_798);
      sVar7 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5a8);
      if (sVar7 < 4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_910);
        poVar5 = std::operator<<((ostream *)local_910,
                                 "Bad line of cmcov file expected at least 4 found: ");
        sVar7 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_5a8);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,sVar7);
        poVar5 = std::operator<<(poVar5," ");
        poVar5 = std::operator<<(poVar5,file);
        poVar5 = std::operator<<(poVar5,"  line:\n[");
        poVar5 = std::operator<<(poVar5,(string *)local_3f8);
        std::operator<<(poVar5,"]\n");
        pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x71,pcVar6,false);
        std::__cxx11::string::~string((string *)&i);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_910);
        for (local_938 = 0;
            sVar7 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)local_5a8), local_938 < sVar7; local_938 = local_938 + 1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_ab0);
          poVar5 = std::operator<<((ostream *)local_ab0,"");
          pvVar8 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_5a8,1);
          poVar5 = std::operator<<(poVar5,(string *)pvVar8);
          std::operator<<(poVar5," ");
          pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
          std::__cxx11::ostringstream::str();
          pcVar6 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                       ,0x73,pcVar6,false);
          std::__cxx11::string::~string(local_ad0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_ab0);
        }
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_c48);
        std::operator<<((ostream *)local_c48,"\n");
        pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x75,pcVar6,false);
        std::__cxx11::string::~string(local_c68);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_c48);
        this_local._7_1_ = false;
        goto LAB_0021db66;
      }
      uVar9 = std::__cxx11::string::empty();
      if ((uVar9 & 1) == 0) {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_5a8,0);
        str = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)pvVar8);
        bVar3 = cmHasLiteralPrefix<7ul>(str,(char (*) [7])"Totals");
        if (bVar3) {
          std::__cxx11::string::clear();
          std::__cxx11::string::clear();
        }
        else {
LAB_0021d876:
          uVar9 = std::__cxx11::string::empty();
          if ((uVar9 & 1) == 0) {
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<int,_std::allocator<int>_>_>_>_>
                      ::operator[](&((this->super_cmParseMumpsCoverage).Coverage)->TotalCoverage,
                                   (key_type *)local_780);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_5a8,1);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            iVar4 = atoi(pcVar6);
            uVar9 = (ulong)(iVar4 + -1);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_5a8,2);
            pcVar6 = (char *)std::__cxx11::string::c_str();
            iVar4 = atoi(pcVar6);
            sVar7 = std::vector<int,_std::allocator<int>_>::size(this_00);
            if (sVar7 < uVar9) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_fa0);
              poVar5 = std::operator<<((ostream *)local_fa0,
                                       "Parse error line is greater than number of lines in file: ")
              ;
              poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar9);
              poVar5 = std::operator<<(poVar5," ");
              poVar5 = std::operator<<(poVar5,(string *)local_780);
              std::operator<<(poVar5,"\n");
              pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
              std::__cxx11::ostringstream::str();
              pcVar6 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar1,7,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                           ,0x9d,pcVar6,false);
              std::__cxx11::string::~string(local_fc0);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_fa0);
            }
            else {
              while (sVar7 = std::vector<int,_std::allocator<int>_>::size(this_00), sVar7 <= uVar9)
              {
                local_fc4 = -1;
                std::vector<int,_std::allocator<int>_>::push_back(this_00,&local_fc4);
              }
              pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,uVar9);
              if ((*pvVar10 == -1) && (0 < iVar4)) {
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,uVar9);
                *pvVar10 = iVar4 + 1 + *pvVar10;
              }
              else {
                pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](this_00,uVar9);
                *pvVar10 = iVar4 + *pvVar10;
              }
            }
          }
        }
      }
      else {
        pvVar8 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_5a8,0);
        std::__cxx11::string::operator=
                  ((string *)(filepath.field_2._M_local_buf + 8),(string *)pvVar8);
        bVar3 = cmParseMumpsCoverage::FindMumpsFile
                          (&this->super_cmParseMumpsCoverage,(string *)((long)&filepath.field_2 + 8)
                           ,(string *)local_780);
        if (bVar3) goto LAB_0021d876;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_de0);
        poVar5 = std::operator<<((ostream *)local_de0,"Could not find mumps file for routine: ");
        poVar5 = std::operator<<(poVar5,(string *)(filepath.field_2._M_local_buf + 8));
        std::operator<<(poVar5,"\n");
        pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
        std::__cxx11::ostringstream::str();
        pcVar6 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                     ,0x80,pcVar6,false);
        std::__cxx11::string::~string(local_e00);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_de0);
        std::__cxx11::string::clear();
      }
    }
    this_local._7_1_ = true;
LAB_0021db66:
    line.field_2._12_4_ = 1;
    std::__cxx11::string::~string((string *)local_780);
    std::__cxx11::string::~string((string *)(filepath.field_2._M_local_buf + 8));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_5a8);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_570);
    poVar5 = std::operator<<((ostream *)local_570,"Empty file : ");
    poVar5 = std::operator<<(poVar5,file);
    poVar5 = std::operator<<(poVar5,"  referenced in this line of cmcov data:\n[");
    poVar5 = std::operator<<(poVar5,(string *)local_3f8);
    std::operator<<(poVar5,"]\n");
    pcVar1 = (this->super_cmParseMumpsCoverage).CTest;
    std::__cxx11::ostringstream::str();
    pcVar6 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar1,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CTest/cmParseCacheCoverage.cxx"
                 ,0x56,pcVar6,false);
    std::__cxx11::string::~string
              ((string *)
               &separateLine.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_570);
    this_local._7_1_ = false;
    line.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_3f8);
LAB_0021dbce:
  std::ifstream::~ifstream(&local_228);
  return this_local._7_1_;
}

Assistant:

bool cmParseCacheCoverage::ReadCMCovFile(const char* file)
{
  cmsys::ifstream in(file);
  if (!in) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Can not open : " << file << "\n");
    return false;
  }
  std::string line;
  if (!cmSystemTools::GetLineFromStream(in, line)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Empty file : " << file
                               << "  referenced in this line of cmcov data:\n"
                                  "["
                               << line << "]\n");
    return false;
  }
  std::vector<std::string> separateLine =
    cmSystemTools::SplitString(line, ',');
  if (separateLine.size() != 4 || separateLine[0] != "Routine" ||
      separateLine[1] != "Line" || separateLine[2] != "RtnLine" ||
      separateLine[3] != "Code") {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Bad first line of cmcov file : " << file
                                                 << "  line:\n"
                                                    "["
                                                 << line << "]\n");
  }
  std::string routine;
  std::string filepath;
  while (cmSystemTools::GetLineFromStream(in, line)) {
    // parse the comma separated line
    separateLine = cmSystemTools::SplitString(line, ',');
    // might have more because code could have a quoted , in it
    // but we only care about the first 3 args anyway
    if (separateLine.size() < 4) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Bad line of cmcov file expected at least 4 found: "
                   << separateLine.size() << " " << file
                   << "  line:\n"
                      "["
                   << line << "]\n");
      for (std::string::size_type i = 0; i < separateLine.size(); ++i) {
        cmCTestLog(this->CTest, ERROR_MESSAGE, "" << separateLine[1] << " ");
      }
      cmCTestLog(this->CTest, ERROR_MESSAGE, "\n");
      return false;
    }
    // if we do not have a routine yet, then it should be
    // the first argument in the vector
    if (routine.empty()) {
      routine = separateLine[0];
      // Find the full path to the file
      if (!this->FindMumpsFile(routine, filepath)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "Could not find mumps file for routine: " << routine
                                                             << "\n");
        filepath.clear();
        continue; // move to next line
      }
    }
    // if we have a routine name, check for end of routine
    else {
      // Totals in arg 0 marks the end of a routine
      if (cmHasLiteralPrefix(separateLine[0], "Totals")) {
        routine.clear(); // at the end of this routine
        filepath.clear();
        continue; // move to next line
      }
    }
    // if the file path was not found for the routine
    // move to next line. We should have already warned
    // after the call to FindMumpsFile that we did not find
    // it, so don't report again to cut down on output
    if (filepath.empty()) {
      continue;
    }
    // now we are ready to set the coverage from the line of data
    cmCTestCoverageHandlerContainer::SingleFileCoverageVector& coverageVector =
      this->Coverage.TotalCoverage[filepath];
    std::string::size_type linenumber = atoi(separateLine[1].c_str()) - 1;
    int count = atoi(separateLine[2].c_str());
    if (linenumber > coverageVector.size()) {
      cmCTestLog(this->CTest, ERROR_MESSAGE,
                 "Parse error line is greater than number of lines in file: "
                   << linenumber << " " << filepath << "\n");
      continue; // skip setting count to avoid crash
    }
    // now add to count for linenumber
    // for some reason the cache coverage adds extra lines to the
    // end of the file in some cases. Since they do not exist, we will
    // mark them as non executable
    while (linenumber >= coverageVector.size()) {
      coverageVector.push_back(-1);
    }
    // Accounts for lines that were previously marked
    // as non-executable code (-1). if the parser comes back with
    // a non-zero count, increase the count by 1 to push the line
    // into the executable code set in addition to the count found.
    if (coverageVector[linenumber] == -1 && count > 0) {
      coverageVector[linenumber] += count + 1;
    } else {
      coverageVector[linenumber] += count;
    }
  }
  return true;
}